

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.hpp
# Opt level: O2

void __thiscall
boost::random::
mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
::seed(mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
       *this,uint *value)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = *value;
  this->x[0] = uVar2;
  for (lVar1 = 1; lVar1 != 0x270; lVar1 = lVar1 + 1) {
    uVar2 = (uVar2 >> 0x1e ^ uVar2) * 0x6c078965 + (int)lVar1;
    this->x[lVar1] = uVar2;
  }
  this->i = 0x270;
  normalize_state(this);
  return;
}

Assistant:

BOOST_RANDOM_DETAIL_ARITHMETIC_SEED(mersenne_twister_engine, UIntType, value)
    {
        // New seeding algorithm from
        // http://www.math.sci.hiroshima-u.ac.jp/~m-mat/MT/MT2002/emt19937ar.html
        // In the previous versions, MSBs of the seed affected only MSBs of the
        // state x[].
        const UIntType mask = (max)();
        x[0] = value & mask;
        for (i = 1; i < n; i++) {
            // See Knuth "The Art of Computer Programming"
            // Vol. 2, 3rd ed., page 106
            x[i] = (f * (x[i-1] ^ (x[i-1] >> (w-2))) + i) & mask;
        }

        normalize_state();
    }